

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg3s>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg3s *r1,mrg3s *r2,long N,long skip1,long skip2)

{
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>> *p_Var1
  ;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_58,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    lVar8 = 0;
    do {
      iVar5 = (r1->S).r[0];
      iVar7 = (r1->S).r[1];
      uVar3 = (long)(r1->S).r[2] * (long)(r1->P).a[2] +
              (long)(r1->P).a[1] * (long)iVar7 + (long)(r1->P).a[0] * (long)iVar5;
      (r1->S).r[2] = iVar7;
      (r1->S).r[1] = iVar5;
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      iVar5 = (int)uVar3;
      local_7c = iVar5 + -0x7fffadb3;
      if (uVar3 < 0x7fffadb3) {
        local_7c = iVar5;
      }
      (r1->S).r[0] = local_7c;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_7c;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar5 = (r2->S).r[0];
      iVar7 = (r2->S).r[1];
      uVar3 = (long)(r2->S).r[2] * (long)(r2->P).a[2] +
              (long)(r2->P).a[1] * (long)iVar7 + (long)(r2->P).a[0] * (long)iVar5;
      (r2->S).r[2] = iVar7;
      (r2->S).r[1] = iVar5;
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
      iVar5 = (int)uVar3;
      local_7c = iVar5 + -0x7fffadb3;
      if (uVar3 < 0x7fffadb3) {
        local_7c = iVar5;
      }
      (r2->S).r[0] = local_7c;
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_7c;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        lVar4 = skip1;
        iVar5 = (r1->S).r[2];
        iVar7 = (r1->S).r[0];
        iVar6 = (r1->S).r[1];
        do {
          iVar2 = iVar6;
          iVar6 = iVar7;
          uVar3 = (long)iVar5 * (long)(r1->P).a[2] +
                  (long)iVar2 * (long)(r1->P).a[1] + (long)iVar6 * (long)(r1->P).a[0];
          uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
          uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
          iVar5 = (int)uVar3;
          iVar7 = iVar5 + -0x7fffadb3;
          if (uVar3 < 0x7fffadb3) {
            iVar7 = iVar5;
          }
          lVar4 = lVar4 + -1;
          iVar5 = iVar2;
        } while (lVar4 != 0);
        (r1->S).r[2] = iVar2;
        (r1->S).r[1] = iVar6;
        (r1->S).r[0] = iVar7;
      }
      if (0 < skip2) {
        lVar4 = skip2;
        iVar5 = (r2->S).r[2];
        iVar7 = (r2->S).r[0];
        iVar6 = (r2->S).r[1];
        do {
          iVar2 = iVar6;
          iVar6 = iVar7;
          uVar3 = (long)iVar5 * (long)(r2->P).a[2] +
                  (long)iVar2 * (long)(r2->P).a[1] + (long)iVar6 * (long)(r2->P).a[0];
          uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
          uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
          iVar5 = (int)uVar3;
          iVar7 = iVar5 + -0x7fffadb3;
          if (uVar3 < 0x7fffadb3) {
            iVar7 = iVar5;
          }
          lVar4 = lVar4 + -1;
          iVar5 = iVar2;
        } while (lVar4 != 0);
        (r2->S).r[2] = iVar2;
        (r2->S).r[1] = iVar6;
        (r2->S).r[0] = iVar7;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != local_38);
  }
  p_Var1 = local_40;
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_58,&local_78);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         p_Var1;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}